

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

uintptr_t virt_to_phys(void *virt)

{
  int *piVar1;
  ulong in_RDI;
  char buf_2 [512];
  int err_2;
  int64_t result_2;
  uintptr_t phy;
  char buf_1 [512];
  int err_1;
  int64_t result_1;
  char buf [512];
  int err;
  int64_t result;
  int fd;
  long pagesize;
  undefined1 local_668 [516];
  int local_464;
  ssize_t local_460;
  ulong local_458;
  __off_t local_450;
  undefined1 local_448 [524];
  int local_23c;
  __off_t local_238;
  long local_230;
  undefined1 local_228 [516];
  int local_24;
  long local_20;
  int local_14;
  ulong local_10;
  ulong local_8;
  
  local_8 = in_RDI;
  local_10 = sysconf(0x1e);
  local_14 = open("/proc/self/pagemap",0);
  local_230 = (long)local_14;
  local_20 = local_230;
  if (local_230 == -1) {
    piVar1 = __errno_location();
    local_24 = *piVar1;
    __xpg_strerror_r(local_24,local_228,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x19,
            "virt_to_phys","getting pagemap",local_228);
    exit(local_24);
  }
  local_450 = lseek(local_14,local_8 / local_10 << 3,0);
  local_238 = local_450;
  if (local_450 == -1) {
    piVar1 = __errno_location();
    local_23c = *piVar1;
    __xpg_strerror_r(local_23c,local_448,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x1b,
            "virt_to_phys","getting pagemap",local_448);
    exit(local_23c);
  }
  local_458 = 0;
  local_460 = read(local_14,&local_458,8);
  if (local_460 == -1) {
    piVar1 = __errno_location();
    local_464 = *piVar1;
    __xpg_strerror_r(local_464,local_668,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x1d,
            "virt_to_phys","translating address",local_668);
    exit(local_464);
  }
  close(local_14);
  if (local_458 == 0) {
    fprintf(_stderr,
            "[ERROR] %s:%d %s(): failed to translate virtual address %p to physical address\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x20,
            "virt_to_phys",local_8);
    abort();
  }
  return (local_458 & 0x7fffffffffffff) * local_10 + local_8 % local_10;
}

Assistant:

static uintptr_t virt_to_phys(void* virt) {
	long pagesize = sysconf(_SC_PAGESIZE);
	int fd = check_err(open("/proc/self/pagemap", O_RDONLY), "getting pagemap");
	// pagemap is an array of pointers for each normal-sized page
	check_err(lseek(fd, (uintptr_t) virt / pagesize * sizeof(uintptr_t), SEEK_SET), "getting pagemap");
	uintptr_t phy = 0;
	check_err(read(fd, &phy, sizeof(phy)), "translating address");
	close(fd);
	if (!phy) {
		error("failed to translate virtual address %p to physical address", virt);
	}
	// bits 0-54 are the page number
	return (phy & 0x7fffffffffffffULL) * pagesize + ((uintptr_t) virt) % pagesize;
}